

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_int32 *
drwav_open_file_and_read_pcm_frames_s32
          (char *filename,uint *channelsOut,uint *sampleRateOut,drwav_uint64 *totalFrameCountOut,
          drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  drwav wav;
  char *in_stack_fffffffffffffe18;
  drwav *in_stack_fffffffffffffe20;
  drwav_uint64 *in_stack_fffffffffffffe30;
  uint *in_stack_fffffffffffffe38;
  uint *in_stack_fffffffffffffe40;
  drwav *in_stack_fffffffffffffe48;
  undefined8 local_8;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = 0;
  }
  dVar1 = drwav_init_file(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          (drwav_allocation_callbacks *)0x110ca3);
  if (dVar1 == 0) {
    local_8 = (drwav_int32 *)0x0;
  }
  else {
    local_8 = drwav__read_pcm_frames_and_close_s32
                        (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                         in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  }
  return local_8;
}

Assistant:

DRWAV_API drwav_int32* drwav_open_file_and_read_pcm_frames_s32(const char* filename, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    drwav wav;

    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }

    if (!drwav_init_file(&wav, filename, pAllocationCallbacks)) {
        return NULL;
    }

    return drwav__read_pcm_frames_and_close_s32(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}